

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FunctionPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPortSyntax,slang::syntax::FunctionPortSyntax_const&>
          (BumpAllocator *this,FunctionPortSyntax *args)

{
  FunctionPortSyntax *pFVar1;
  FunctionPortSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pFVar1 = (FunctionPortSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::FunctionPortSyntax::FunctionPortSyntax(in_RSI,pFVar1);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }